

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O3

OutRec * ClipperLib::GetLowermostRec(OutRec *outRec1,OutRec *outRec2)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  OutPt *btmPt1;
  OutPt *btmPt2;
  OutRec *pOVar4;
  
  btmPt1 = outRec1->BottomPt;
  if (btmPt1 == (OutPt *)0x0) {
    btmPt1 = GetBottomPt(outRec1->Pts);
    outRec1->BottomPt = btmPt1;
  }
  btmPt2 = outRec2->BottomPt;
  if (btmPt2 == (OutPt *)0x0) {
    btmPt2 = GetBottomPt(outRec2->Pts);
    outRec2->BottomPt = btmPt2;
    btmPt1 = outRec1->BottomPt;
  }
  lVar1 = (btmPt2->Pt).Y;
  lVar2 = (btmPt1->Pt).Y;
  pOVar4 = outRec1;
  if ((lVar2 <= lVar1) && (pOVar4 = outRec2, lVar1 <= lVar2)) {
    lVar1 = (btmPt2->Pt).X;
    lVar2 = (btmPt1->Pt).X;
    pOVar4 = outRec1;
    if (((lVar1 <= lVar2) &&
        (((pOVar4 = outRec2, lVar2 <= lVar1 && (btmPt1->Next != btmPt1)) &&
         (pOVar4 = outRec1, btmPt2->Next != btmPt2)))) &&
       (bVar3 = FirstIsBottomPt(btmPt1,btmPt2), !bVar3)) {
      pOVar4 = outRec2;
    }
  }
  return pOVar4;
}

Assistant:

OutRec* GetLowermostRec(OutRec *outRec1, OutRec *outRec2)
{
  //work out which polygon fragment has the correct hole state ...
  if (!outRec1->BottomPt) 
    outRec1->BottomPt = GetBottomPt(outRec1->Pts);
  if (!outRec2->BottomPt) 
    outRec2->BottomPt = GetBottomPt(outRec2->Pts);
  OutPt *OutPt1 = outRec1->BottomPt;
  OutPt *OutPt2 = outRec2->BottomPt;
  if (OutPt1->Pt.Y > OutPt2->Pt.Y) return outRec1;
  else if (OutPt1->Pt.Y < OutPt2->Pt.Y) return outRec2;
  else if (OutPt1->Pt.X < OutPt2->Pt.X) return outRec1;
  else if (OutPt1->Pt.X > OutPt2->Pt.X) return outRec2;
  else if (OutPt1->Next == OutPt1) return outRec2;
  else if (OutPt2->Next == OutPt2) return outRec1;
  else if (FirstIsBottomPt(OutPt1, OutPt2)) return outRec1;
  else return outRec2;
}